

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_thrower.hpp
# Opt level: O2

string * __thiscall
asd::detail::formatter<unsigned_long_const&>
          (string *__return_storage_ptr__,detail *this,char *fmt,unsigned_long *head)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *format;
  detail *this_00;
  string str;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  ostringstream local_1a0 [376];
  
  paVar1 = &local_220.field_2;
  local_220._M_string_length = 0;
  local_220.field_2._M_local_buf[0] = '\0';
  this_00 = this + 1;
  local_220._M_dataplus._M_p = (pointer)paVar1;
  do {
    if (this_00[-1] == (detail)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                      local_220.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_220.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_220._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                      local_220.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_220._M_string_length;
      local_220._M_string_length = 0;
      local_220.field_2._M_local_buf[0] = '\0';
      local_220._M_dataplus._M_p = (pointer)paVar1;
LAB_00163188:
      std::__cxx11::string::~string((string *)&local_220);
      return __return_storage_ptr__;
    }
    if (this_00[-1] == (detail)0x25) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::__cxx11::stringbuf::str();
      std::operator+(&local_1c0,&local_220,&local_1e0);
      formatter_abi_cxx11_(&local_200,this_00,format);
      std::operator+(__return_storage_ptr__,&local_1c0,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
      goto LAB_00163188;
    }
    std::__cxx11::string::push_back((char)&local_220);
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

std::string
formatter(const char* fmt, T&& head, Ts&& ... tail)
{
    std::string str;
    for(const char* i(fmt); *i != '\0'; ++i)
    {
        if(*i == '%')
        {
            std::ostringstream oss;
            oss << head;
            ++i;
            return str + oss.str() + formatter(i, std::forward<Ts>(tail)...);
        }
        else
        {
            str += *i;
        }
    }
    return str;
}